

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O1

void __thiscall
Callback::Emitter::emit<MyEmitter,String>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0)

{
  Item **ppIVar1;
  usize *puVar2;
  String *in_RCX;
  code *pcVar3;
  Iterator IVar4;
  long *plVar5;
  SignalActivation activation;
  String local_98;
  SignalActivation local_70;
  Memory local_48 [16];
  offset_in_MyEmitter_to_subr local_38;
  String *local_30;
  
  local_38 = signal;
  local_30 = arg0;
  Memory::copy(local_48,(EVP_PKEY_CTX *)&local_38,(EVP_PKEY_CTX *)0x10);
  SignalActivation::SignalActivation(&local_70,this,(MemberFuncPtr *)local_48);
  IVar4.item = local_70.begin.item;
  if (local_70.end.item != local_70.begin.item) {
    do {
      if (((IVar4.item)->value).state == connected) {
        pcVar3 = (code *)((IVar4.item)->value).slot.ptr;
        plVar5 = (long *)((long)((IVar4.item)->value).object +
                         *(long *)&((IVar4.item)->value).slot.field_0x8);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar5 + -1);
        }
        String::String(&local_98,in_RCX);
        (*pcVar3)(plVar5,&local_98);
        if ((local_98.data)->ref != 0) {
          LOCK();
          puVar2 = &(local_98.data)->ref;
          *puVar2 = *puVar2 - 1;
          UNLOCK();
          if ((*puVar2 == 0) && (local_98.data != (Data *)0x0)) {
            operator_delete__(local_98.data);
          }
        }
      }
    } while ((local_70.invalidated == false) &&
            (ppIVar1 = &(IVar4.item)->next, IVar4.item = *ppIVar1, *ppIVar1 != local_70.end.item));
  }
  SignalActivation::~SignalActivation(&local_70);
  return;
}

Assistant:

void emit(void (X::*signal)(A), A arg0) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr1<X, A>*)&i->slot)->ptr)(arg0); if(activation.invalidated) return;}}